

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool FIX::Session::sendToTarget(Message *message,string *sender,string *target,string *qualifier)

{
  bool bVar1;
  TargetCompID local_e8;
  SenderCompID local_88;
  string *local_28;
  string *qualifier_local;
  string *target_local;
  string *sender_local;
  Message *message_local;
  
  local_28 = qualifier;
  qualifier_local = target;
  target_local = sender;
  sender_local = (string *)message;
  SenderCompID::SenderCompID(&local_88,sender);
  TargetCompID::TargetCompID(&local_e8,qualifier_local);
  bVar1 = sendToTarget(message,&local_88,&local_e8,local_28);
  TargetCompID::~TargetCompID(&local_e8);
  SenderCompID::~SenderCompID(&local_88);
  return bVar1;
}

Assistant:

bool Session::sendToTarget
( Message& message, const std::string& sender, const std::string& target,
  const std::string& qualifier )
EXCEPT ( SessionNotFound )
{
  return sendToTarget( message, SenderCompID( sender ),
                       TargetCompID( target ), qualifier );
}